

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseBrackets(Parser *this)

{
  bool bVar1;
  Token *this_00;
  Parser *in_RSI;
  undefined1 local_38 [31];
  undefined1 local_19;
  Parser *this_local;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *result;
  
  this_local = this;
  sanityExpect(in_RSI,TOK_OP_BRACKET_OPEN);
  local_19 = 0;
  parseExpression(this,(Precedence)in_RSI);
  bVar1 = expect(in_RSI,TOK_BRACKET_CLOSE);
  if (!bVar1) {
    local_38._6_2_ = 2;
    local_38._0_4_ = 1;
    this_00 = Lexer::getCurrentToken(in_RSI->lexer);
    Token::getPosition(this_00);
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)(local_38 + 8),(SyntaxErrorCode *)(local_38 + 6),(Position *)local_38);
    generateError((Parser *)(local_38 + 0x10),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_38 + 0x10));
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)(local_38 + 8));
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseBrackets() noexcept {
  sanityExpect(TokenType::TOK_OP_BRACKET_OPEN);

  std::unique_ptr<Expr> result(parseExpression());
  if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET,
      lexer.getCurrentToken()->getPosition()));
  }

  return result;
}